

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StereoMatching.hpp
# Opt level: O0

Mat * ncc(Mat *in1,Mat *in2,string *type,bool add_constant)

{
  uchar uVar1;
  byte bVar2;
  bool bVar3;
  size_type __n;
  uchar *puVar4;
  int *piVar5;
  byte *pbVar6;
  reference pvVar7;
  reference pvVar8;
  undefined7 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  byte in_R8B;
  double dVar9;
  __type _Var10;
  double dVar11;
  double dVar12;
  int local_320;
  int local_31c;
  int j_3;
  int i_4;
  int j_2;
  int i_3;
  double numerator_1;
  double right_std_1;
  double left_std_1;
  double right_mean_1;
  double left_mean_1;
  int j_1;
  int i_2;
  int j;
  int i_1;
  double numerator;
  double right_std;
  double left_std;
  double right_mean;
  double left_mean;
  double res_ncc;
  double n;
  int local_298;
  int local_294;
  int end_y;
  int local_28c;
  int local_288;
  int end_x;
  int local_280;
  int local_27c;
  int start_y;
  int local_274;
  int local_270;
  int start_x;
  int x_4;
  int y_2;
  int local_260;
  int local_25c;
  int x_3;
  int x_2;
  int y_1;
  int x_1;
  int x;
  int y;
  Mat tmp_1;
  int local_1e8;
  allocator<double> local_1e1;
  int offset;
  undefined1 local_1d8 [8];
  vector<double,_std::allocator<double>_> tmp;
  undefined1 local_1b8 [4];
  int i;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  max_ncc;
  Mat depth;
  Scalar_<double> local_140;
  Mat local_110 [8];
  Mat right;
  Mat local_b0 [8];
  Mat left;
  int kernel_size;
  int max_offset;
  int local_3c;
  int local_38;
  int height;
  int local_30;
  byte local_29;
  int width;
  bool add_constant_local;
  string *type_local;
  Mat *in2_local;
  Mat *in1_local;
  Mat *tmp_2;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT71(in_register_00000009,add_constant);
  local_29 = in_R8B & 1;
  _width = __lhs;
  type_local = type;
  in2_local = in2;
  in1_local = in1;
  cv::MatSize::operator()((MatSize *)&local_38);
  local_30 = local_38;
  cv::MatSize::operator()((MatSize *)&kernel_size);
  local_3c = max_offset;
  bgr_to_grey(local_b0);
  bgr_to_grey(local_110);
  if ((local_29 & 1) != 0) {
    cv::Scalar_<double>::Scalar_(&local_140,10.0);
    cv::operator+=(local_110,&local_140);
  }
  cv::Mat::Mat((Mat *)&max_ncc.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,local_3c,local_30,0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_1b8);
  for (tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < local_3c;
      tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    __n = (size_type)local_30;
    _offset = -2.0;
    std::allocator<double>::allocator(&local_1e1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_1d8,__n,
               (value_type_conflict1 *)&offset,&local_1e1);
    std::allocator<double>::~allocator(&local_1e1);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)local_1b8,(value_type *)local_1d8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_1d8);
  }
  for (local_1e8 = 1; local_1e8 < 0x50; local_1e8 = local_1e8 + 1) {
    cv::Mat::Mat((Mat *)&x,local_3c,local_30,0);
    bVar3 = std::operator==(__lhs,"left");
    if (bVar3) {
      for (x_1 = 0; x_1 < local_3c; x_1 = x_1 + 1) {
        for (y_1 = 0; y_1 < local_1e8; y_1 = y_1 + 1) {
          puVar4 = cv::Mat::at<unsigned_char>(local_110,x_1,y_1);
          uVar1 = *puVar4;
          puVar4 = cv::Mat::at<unsigned_char>((Mat *)&x,x_1,y_1);
          *puVar4 = uVar1;
        }
        for (x_2 = local_1e8; x_2 < local_30; x_2 = x_2 + 1) {
          puVar4 = cv::Mat::at<unsigned_char>(local_110,x_1,x_2 - local_1e8);
          uVar1 = *puVar4;
          puVar4 = cv::Mat::at<unsigned_char>((Mat *)&x,x_1,x_2);
          *puVar4 = uVar1;
        }
      }
LAB_0010a085:
      for (start_x = 0; start_x < local_3c; start_x = start_x + 1) {
        for (local_270 = 0; local_270 < local_30; local_270 = local_270 + 1) {
          start_y = 0;
          local_27c = local_270 + -3;
          piVar5 = std::max<int>(&start_y,&local_27c);
          local_274 = *piVar5;
          end_x = 0;
          local_288 = start_x + -3;
          piVar5 = std::max<int>(&end_x,&local_288);
          local_280 = *piVar5;
          end_y = local_30 + -1;
          local_294 = local_270 + 3;
          piVar5 = std::min<int>(&end_y,&local_294);
          local_28c = *piVar5;
          n._4_4_ = local_3c + -1;
          n._0_4_ = start_x + 3;
          piVar5 = std::min<int>((int *)((long)&n + 4),(int *)&n);
          local_298 = *piVar5;
          dVar9 = (double)((local_298 - local_280) * (local_28c - local_274));
          bVar3 = std::operator==(__lhs,"left");
          if (bVar3) {
            right_mean = 0.0;
            left_std = 0.0;
            right_std = 0.0;
            numerator = 0.0;
            _j = 0.0;
            for (i_2 = local_280; i_2 <= local_298; i_2 = i_2 + 1) {
              for (j_1 = local_274; j_1 <= local_28c; j_1 = j_1 + 1) {
                pbVar6 = cv::Mat::at<unsigned_char>(local_b0,i_2,j_1);
                right_mean = right_mean + (double)*pbVar6;
                pbVar6 = cv::Mat::at<unsigned_char>((Mat *)&x,i_2,j_1);
                left_std = (double)*pbVar6 + left_std;
              }
            }
            for (left_mean_1._4_4_ = local_280; left_mean_1._4_4_ <= local_298;
                left_mean_1._4_4_ = left_mean_1._4_4_ + 1) {
              for (left_mean_1._0_4_ = local_274; left_mean_1._0_4_ <= local_28c;
                  left_mean_1._0_4_ = left_mean_1._0_4_ + 1) {
                pbVar6 = cv::Mat::at<unsigned_char>(local_b0,left_mean_1._4_4_,left_mean_1._0_4_);
                _Var10 = std::pow<double,int>((double)*pbVar6 - right_mean / dVar9,2);
                right_std = right_std + _Var10;
                pbVar6 = cv::Mat::at<unsigned_char>((Mat *)&x,left_mean_1._4_4_,left_mean_1._0_4_);
                _Var10 = std::pow<double,int>((double)*pbVar6 - left_std / dVar9,2);
                numerator = numerator + _Var10;
                pbVar6 = cv::Mat::at<unsigned_char>(local_b0,left_mean_1._4_4_,left_mean_1._0_4_);
                bVar2 = *pbVar6;
                pbVar6 = cv::Mat::at<unsigned_char>((Mat *)&x,left_mean_1._4_4_,left_mean_1._0_4_);
                _j = ((double)bVar2 - right_mean / dVar9) * ((double)*pbVar6 - left_std / dVar9) +
                     _j;
              }
            }
            dVar11 = sqrt(right_std / dVar9);
            dVar12 = sqrt(numerator / dVar9);
            dVar11 = (_j / dVar9) / (dVar11 * dVar12);
          }
          else {
            right_mean_1 = 0.0;
            left_std_1 = 0.0;
            right_std_1 = 0.0;
            numerator_1 = 0.0;
            _j_2 = 0.0;
            for (i_4 = local_280; i_4 <= local_298; i_4 = i_4 + 1) {
              for (j_3 = local_274; j_3 <= local_28c; j_3 = j_3 + 1) {
                pbVar6 = cv::Mat::at<unsigned_char>((Mat *)&x,i_4,j_3);
                right_mean_1 = right_mean_1 + (double)*pbVar6;
                pbVar6 = cv::Mat::at<unsigned_char>(local_110,i_4,j_3);
                left_std_1 = (double)*pbVar6 + left_std_1;
              }
            }
            for (local_31c = local_280; local_31c <= local_298; local_31c = local_31c + 1) {
              for (local_320 = local_274; local_320 <= local_28c; local_320 = local_320 + 1) {
                pbVar6 = cv::Mat::at<unsigned_char>((Mat *)&x,local_31c,local_320);
                _Var10 = std::pow<double,int>((double)*pbVar6 - right_mean_1 / dVar9,2);
                right_std_1 = right_std_1 + _Var10;
                pbVar6 = cv::Mat::at<unsigned_char>(local_110,local_31c,local_320);
                _Var10 = std::pow<double,int>((double)*pbVar6 - left_std_1 / dVar9,2);
                numerator_1 = numerator_1 + _Var10;
                pbVar6 = cv::Mat::at<unsigned_char>((Mat *)&x,local_31c,local_320);
                bVar2 = *pbVar6;
                pbVar6 = cv::Mat::at<unsigned_char>(local_110,local_31c,local_320);
                _j_2 = ((double)bVar2 - right_mean_1 / dVar9) *
                       ((double)*pbVar6 - left_std_1 / dVar9) + _j_2;
              }
            }
            dVar11 = sqrt(right_std_1 / dVar9);
            dVar12 = sqrt(numerator_1 / dVar9);
            dVar11 = (_j_2 / dVar9) / (dVar11 * dVar12);
          }
          left_mean = dVar11 / dVar9;
          pvVar7 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)local_1b8,(long)start_x);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)local_270);
          if (*pvVar8 <= left_mean && left_mean != *pvVar8) {
            pvVar7 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)local_1b8,(long)start_x);
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar7,(long)local_270);
            *pvVar8 = left_mean;
            puVar4 = cv::Mat::at<unsigned_char>
                               ((Mat *)&max_ncc.
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,start_x,
                                local_270);
            *puVar4 = (char)local_1e8 * '\x03';
          }
        }
      }
      x_4 = 0;
    }
    else {
      bVar3 = std::operator==(__lhs,"right");
      if (bVar3) {
        for (x_3 = 0; x_3 < local_3c; x_3 = x_3 + 1) {
          for (local_25c = 0; local_25c < local_30 - local_1e8; local_25c = local_25c + 1) {
            puVar4 = cv::Mat::at<unsigned_char>(local_b0,x_3,local_25c + local_1e8);
            uVar1 = *puVar4;
            puVar4 = cv::Mat::at<unsigned_char>((Mat *)&x,x_3,local_25c);
            *puVar4 = uVar1;
          }
          for (local_260 = local_30 - local_1e8; local_260 < local_30; local_260 = local_260 + 1) {
            puVar4 = cv::Mat::at<unsigned_char>(local_b0,x_3,local_260);
            uVar1 = *puVar4;
            puVar4 = cv::Mat::at<unsigned_char>((Mat *)&x,x_3,local_260);
            *puVar4 = uVar1;
          }
        }
        goto LAB_0010a085;
      }
      y_2._3_1_ = 0;
      cv::Mat::Mat(in1,0,0,0);
      y_2._3_1_ = 1;
      x_4 = 1;
    }
    cv::Mat::~Mat((Mat *)&x);
    if (x_4 != 0) goto LAB_0010ab34;
  }
  cv::Mat::Mat(in1,(Mat *)&max_ncc.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  x_4 = 1;
LAB_0010ab34:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_1b8);
  cv::Mat::~Mat((Mat *)&max_ncc.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::Mat::~Mat(local_110);
  cv::Mat::~Mat(local_b0);
  return in1;
}

Assistant:

Mat
ncc(Mat in1, Mat in2, string type, bool add_constant=false)
{
    int width = in1.size().width;
    int height = in1.size().height;
    int max_offset = 79;
    int kernel_size = 3; // window size

    Mat left = bgr_to_grey(in1);
    Mat right = bgr_to_grey(in2);

    if (add_constant)
    {
        right += 10;
    }

    Mat depth(height, width, 0);
    vector< vector<double> > max_ncc; // store max NCC value

    for (int i = 0; i < height; ++i)
    {
        vector<double> tmp(width, -2);
        max_ncc.push_back(tmp);
    }

    for (int offset = 1; offset <= max_offset; offset++)
    {
        Mat tmp(height, width, 0);
        // shift image depend on type to save calculation time
        if (type == "left")
        {
            for (int y = 0; y < height; y++)
            {
                for (int x = 0; x < offset; x++)
                {
                    tmp.at<uchar>(y, x) = right.at<uchar>(y, x);
                }

                for (int x = offset; x < width; x++)
                {
                    tmp.at<uchar>(y, x) = right.at<uchar>(y, x - offset);
                }
            }
        }
        else if (type == "right")
        {
            for (int y = 0; y < height; y++)
            {
                for (int x = 0; x < width - offset; x++)
                {
                    tmp.at<uchar>(y, x) = left.at<uchar>(y, x + offset);
                }

                for (int x = width - offset; x < width; x++)
                {
                    tmp.at<uchar>(y, x) = left.at<uchar>(y, x);
                }
            }
        }
        else
        {
            Mat tmp(0, 0, 0);
            return tmp;
        }

        // calculate each pixel's NCC value
        for (int y = 0; y < height; y++)
        {
            for (int x = 0; x < width; x++)
            {
                int start_x = max(0, x - kernel_size);
                int start_y = max(0, y - kernel_size);
                int end_x = min(width - 1, x + kernel_size);
                int end_y = min(height - 1, y + kernel_size);
                double n = (end_y - start_y) * (end_x - start_x);
                double res_ncc = 0;

                if (type == "left")
                {
                    double left_mean = 0, right_mean = 0;
                    double left_std = 0, right_std = 0;
                    double numerator = 0;

                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            left_mean += left.at<uchar>(i, j);
                            right_mean += tmp.at<uchar>(i, j);
                        }
                    }

                    left_mean /= n;
                    right_mean /= n;

                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            left_std += pow(left.at<uchar>(i, j) - left_mean, 2);
                            right_std += pow(tmp.at<uchar>(i, j) - right_mean, 2);
                            numerator += (left.at<uchar>(i, j) - left_mean) * (tmp.at<uchar>(i, j) - right_mean);
                        }
                    }

                    numerator /= n;
                    left_std /= n;
                    right_std /= n;
                    res_ncc = numerator / (sqrt(left_std) * sqrt(right_std)) / n;
                }
                else
                {
                    double left_mean = 0, right_mean = 0;
                    double left_std = 0, right_std = 0;
                    double numerator = 0;

                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            left_mean += tmp.at<uchar>(i, j);
                            right_mean += right.at<uchar>(i, j);
                        }
                    }

                    left_mean /= n;
                    right_mean /= n;

                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            left_std += pow(tmp.at<uchar>(i, j) - left_mean, 2);
                            right_std += pow(right.at<uchar>(i, j) - right_mean, 2);
                            numerator += (tmp.at<uchar>(i, j) - left_mean) * (right.at<uchar>(i, j) - right_mean);
                        }
                    }

                    numerator /= n;
                    left_std /= n;
                    right_std /= n;
                    res_ncc = numerator / (sqrt(left_std) * sqrt(right_std)) / n;
                }

                // greater NCC value found
                if (res_ncc > max_ncc[y][x])
                {
                    max_ncc[y][x] = res_ncc;
                    // for better visualization
                    depth.at<uchar>(y, x) = (uchar)(offset * 3);
                }
            }
        }
    }

    return depth;
}